

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_declare_vtab(sqlite3 *db,char *zCreateTable)

{
  u8 uVar1;
  i16 iVar2;
  VtabCtx *pVVar3;
  Table *pTVar4;
  Table *pTab;
  int iVar5;
  Index *pIVar6;
  char *zFormat;
  uint rc;
  Table *pNew;
  Parse sParse;
  
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  pVVar3 = db->pVtabCtx;
  if ((pVVar3 != (VtabCtx *)0x0) && (pVVar3->bDeclared == 0)) {
    pTVar4 = pVVar3->pTab;
    sqlite3ParseObjectInit(&sParse,db);
    sParse.eParseMode = '\x01';
    sParse.disableTriggers = '\x01';
    uVar1 = (db->init).busy;
    (db->init).busy = '\0';
    sParse.nQueryLoop = 1;
    iVar5 = sqlite3RunParser(&sParse,zCreateTable);
    pTab = sParse.pNewTable;
    if ((sParse.pNewTable == (Table *)0x0 || iVar5 != 0) ||
       ((db->mallocFailed != '\0' || ((sParse.pNewTable)->eTabType != '\0')))) {
      zFormat = "%s";
      if (sParse.zErrMsg == (char *)0x0) {
        zFormat = (char *)0x0;
      }
      rc = 1;
      sqlite3ErrorWithMsg(db,1,zFormat);
      sqlite3DbFree(db,sParse.zErrMsg);
    }
    else {
      rc = 0;
      if (pTVar4->aCol == (Column *)0x0) {
        pTVar4->aCol = (sParse.pNewTable)->aCol;
        sqlite3ExprListDelete(db,((sParse.pNewTable)->u).tab.pDfltList);
        iVar2 = pTab->nCol;
        pTVar4->nCol = iVar2;
        pTVar4->nNVCol = iVar2;
        pTVar4->tabFlags = pTVar4->tabFlags | pTab->tabFlags & 0x280;
        pTab->nCol = 0;
        pTab->aCol = (Column *)0x0;
        rc = 0;
        if (((pTab->tabFlags & 0x80) != 0) &&
           (pVVar3->pVTable->pMod->pModule->xUpdate !=
            (_func_int_sqlite3_vtab_ptr_int_sqlite3_value_ptr_ptr_sqlite3_int64_ptr *)0x0)) {
          pIVar6 = sqlite3PrimaryKeyIndex(pTab);
          rc = (uint)(pIVar6->nKeyCol != 1);
        }
        pIVar6 = pTab->pIndex;
        if (pIVar6 != (Index *)0x0) {
          pTVar4->pIndex = pIVar6;
          pTab->pIndex = (Index *)0x0;
          pIVar6->pTable = pTVar4;
        }
      }
      pVVar3->bDeclared = 1;
    }
    sParse.eParseMode = '\0';
    if (sParse.pVdbe != (Vdbe *)0x0) {
      sqlite3VdbeFinalize(sParse.pVdbe);
    }
    sqlite3DeleteTable(db,sParse.pNewTable);
    sqlite3ParseObjectReset(&sParse);
    (db->init).busy = uVar1;
    iVar5 = sqlite3ApiExit(db,rc);
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
    }
    return iVar5;
  }
  sqlite3Error(db,0x15);
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  iVar5 = sqlite3MisuseError(0x24250);
  return iVar5;
}

Assistant:

SQLITE_API int sqlite3_declare_vtab(sqlite3 *db, const char *zCreateTable){
  VtabCtx *pCtx;
  int rc = SQLITE_OK;
  Table *pTab;
  Parse sParse;
  int initBusy;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) || zCreateTable==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  sqlite3_mutex_enter(db->mutex);
  pCtx = db->pVtabCtx;
  if( !pCtx || pCtx->bDeclared ){
    sqlite3Error(db, SQLITE_MISUSE);
    sqlite3_mutex_leave(db->mutex);
    return SQLITE_MISUSE_BKPT;
  }
  pTab = pCtx->pTab;
  assert( IsVirtual(pTab) );

  sqlite3ParseObjectInit(&sParse, db);
  sParse.eParseMode = PARSE_MODE_DECLARE_VTAB;
  sParse.disableTriggers = 1;
  /* We should never be able to reach this point while loading the
  ** schema.  Nevertheless, defend against that (turn off db->init.busy)
  ** in case a bug arises. */
  assert( db->init.busy==0 );
  initBusy = db->init.busy;
  db->init.busy = 0;
  sParse.nQueryLoop = 1;
  if( SQLITE_OK==sqlite3RunParser(&sParse, zCreateTable)
   && ALWAYS(sParse.pNewTable!=0)
   && ALWAYS(!db->mallocFailed)
   && IsOrdinaryTable(sParse.pNewTable)
  ){
    assert( sParse.zErrMsg==0 );
    if( !pTab->aCol ){
      Table *pNew = sParse.pNewTable;
      Index *pIdx;
      pTab->aCol = pNew->aCol;
      sqlite3ExprListDelete(db, pNew->u.tab.pDfltList);
      pTab->nNVCol = pTab->nCol = pNew->nCol;
      pTab->tabFlags |= pNew->tabFlags & (TF_WithoutRowid|TF_NoVisibleRowid);
      pNew->nCol = 0;
      pNew->aCol = 0;
      assert( pTab->pIndex==0 );
      assert( HasRowid(pNew) || sqlite3PrimaryKeyIndex(pNew)!=0 );
      if( !HasRowid(pNew)
       && pCtx->pVTable->pMod->pModule->xUpdate!=0
       && sqlite3PrimaryKeyIndex(pNew)->nKeyCol!=1
      ){
        /* WITHOUT ROWID virtual tables must either be read-only (xUpdate==0)
        ** or else must have a single-column PRIMARY KEY */
        rc = SQLITE_ERROR;
      }
      pIdx = pNew->pIndex;
      if( pIdx ){
        assert( pIdx->pNext==0 );
        pTab->pIndex = pIdx;
        pNew->pIndex = 0;
        pIdx->pTable = pTab;
      }
    }
    pCtx->bDeclared = 1;
  }else{
    sqlite3ErrorWithMsg(db, SQLITE_ERROR,
          (sParse.zErrMsg ? "%s" : 0), sParse.zErrMsg);
    sqlite3DbFree(db, sParse.zErrMsg);
    rc = SQLITE_ERROR;
  }
  sParse.eParseMode = PARSE_MODE_NORMAL;

  if( sParse.pVdbe ){
    sqlite3VdbeFinalize(sParse.pVdbe);
  }
  sqlite3DeleteTable(db, sParse.pNewTable);
  sqlite3ParseObjectReset(&sParse);
  db->init.busy = initBusy;

  assert( (rc&0xff)==rc );
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}